

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_trd.cpp
# Opt level: O0

ETrdFileName TRD_FileNameToBytes(char *inputName,byte *binName,int *nameL)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int local_48;
  int local_44;
  int local_40;
  int fillIdx;
  char *pcStack_38;
  int maxL;
  char *ext;
  int *piStack_28;
  int baseSz;
  int *nameL_local;
  byte *binName_local;
  char *inputName_local;
  
  ext._4_4_ = 8;
  piStack_28 = nameL;
  nameL_local = (int *)binName;
  binName_local = (byte *)inputName;
  pcStack_38 = strrchr(inputName,0x2e);
  if (pcStack_38 == (char *)0x0) {
    local_48 = 8;
  }
  else {
    local_48 = (int)pcStack_38 - (int)binName_local;
  }
  local_40 = local_48;
  piVar2 = std::min<int>((int *)((long)&ext + 4),&local_40);
  iVar1 = *piVar2;
  *piStack_28 = 0;
  while( true ) {
    bVar3 = false;
    if (binName_local[*piStack_28] != '\0') {
      bVar3 = *piStack_28 < iVar1;
    }
    if (!bVar3) break;
    *(byte *)((long)nameL_local + (long)*piStack_28) = binName_local[*piStack_28];
    *piStack_28 = *piStack_28 + 1;
  }
  while (*piStack_28 < 8) {
    iVar1 = *piStack_28;
    *piStack_28 = iVar1 + 1;
    *(undefined1 *)((long)nameL_local + (long)iVar1) = 0x20;
  }
  while( true ) {
    bVar3 = false;
    if ((pcStack_38 != (char *)0x0) && (bVar3 = false, pcStack_38[1] != '\0')) {
      bVar3 = *piStack_28 < 0xb;
    }
    if (!bVar3) break;
    *(char *)((long)nameL_local + (long)*piStack_28) = pcStack_38[1];
    *piStack_28 = *piStack_28 + 1;
    pcStack_38 = pcStack_38 + 1;
  }
  while( true ) {
    bVar3 = false;
    if (*piStack_28 != 9) {
      bVar3 = *piStack_28 != 0xb;
    }
    if (!bVar3) break;
    iVar1 = *piStack_28;
    *piStack_28 = iVar1 + 1;
    *(undefined1 *)((long)nameL_local + (long)iVar1) = 0x20;
  }
  local_44 = *piStack_28;
  while (local_44 < 0xc) {
    *(undefined1 *)((long)nameL_local + (long)local_44) = 0;
    local_44 = local_44 + 1;
  }
  if (*piStack_28 < 10) {
    if ((*(byte *)(nameL_local + 2) == 0x23) || (*(byte *)(nameL_local + 2) - 0x42 < 3)) {
      inputName_local._4_4_ = OK;
    }
    else {
      inputName_local._4_4_ = INVALID_EXTENSION;
    }
  }
  else {
    inputName_local._4_4_ = THREE_LETTER_EXTENSION;
  }
  return inputName_local._4_4_;
}

Assistant:

ETrdFileName TRD_FileNameToBytes(const char* inputName, byte binName[12], int & nameL) {
	constexpr int baseSz = int(STrdFile::NAME_BASE_SZ);	// pre-cast to `int` (vs `nameL`)
	const char* ext = strrchr(inputName, '.');
	const int maxL = std::min(baseSz, ext ? int(ext-inputName) : baseSz);
	nameL = 0;
	while (inputName[nameL] && nameL < maxL) {
		binName[nameL] = inputName[nameL];
		++nameL;
	}
	while (nameL < baseSz) binName[nameL++] = ' ';
	while (ext && ext[1] && nameL < int(STrdFile::NAME_ALT_FULL_SZ)) {
		binName[nameL] = ext[1];
		++nameL;
		++ext;
	}
	while (STrdFile::NAME_FULL_SZ != nameL && STrdFile::NAME_ALT_FULL_SZ != nameL) {
		binName[nameL++] = ' ';		// the file name is either 8+1 or 8+3 (not 8+2)
	}
	int fillIdx = nameL;
	while (fillIdx < 12) binName[fillIdx++] = 0;
	if (int(STrdFile::NAME_FULL_SZ) < nameL) return THREE_LETTER_EXTENSION;
	switch (binName[baseSz]) {
		case 'B': case 'C': case 'D': case '#':
			return OK;
	}
	return INVALID_EXTENSION;
}